

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O2

void __thiscall
Centaurus::DFA<wchar_t>::filter_nodes(DFA<wchar_t> *this,vector<bool,_std::allocator<bool>_> *mask)

{
  vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_> *this_00;
  pointer pNVar1;
  const_reference cVar2;
  DFAState<wchar_t> *n;
  reference pvVar3;
  pointer pDVar4;
  pointer pDVar5;
  pointer pDVar6;
  pointer pNVar7;
  ulong __n;
  NFATransition<wchar_t> *t;
  int local_8c;
  vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_> nodes;
  vector<int,_std::allocator<int>_> index_map;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  filtered;
  
  nodes.
  super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nodes.
  super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  nodes.
  super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            (&index_map,
             ((long)(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                    super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                   super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x48,(allocator_type *)&filtered);
  pDVar5 = (this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
           super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pDVar6 = (this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
           super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((long)pDVar5 - (long)pDVar6) / 0x48 !=
      (ulong)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8) {
    __assert_fail("m_states.size() == mask.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/DFA.hpp"
                  ,0xe9,
                  "void Centaurus::DFA<wchar_t>::filter_nodes(const std::vector<bool> &) [TCHAR = wchar_t]"
                 );
  }
  this_00 = &(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states;
  local_8c = 0;
  for (__n = 0; pDVar4 = nodes.
                         super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
      __n < (ulong)(((long)pDVar5 - (long)pDVar6) / 0x48); __n = __n + 1) {
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](mask,__n);
    if (cVar2) {
      filtered.
      super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      filtered.
      super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      filtered.
      super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pvVar3 = std::
               vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
               ::at(this_00,__n);
      pNVar1 = (pvVar3->super_NFABaseState<wchar_t,_Centaurus::IndexVector>).m_transitions.
               super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pNVar7 = (pvVar3->super_NFABaseState<wchar_t,_Centaurus::IndexVector>).m_transitions.
                    super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pNVar7 != pNVar1; pNVar7 = pNVar7 + 1
          ) {
        cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](mask,(long)pNVar7->m_dest);
        if (cVar2) {
          std::
          vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
          ::push_back(&filtered,pNVar7);
        }
      }
      pvVar3 = std::
               vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
               ::at(this_00,__n);
      std::vector<Centaurus::DFAState<wchar_t>,std::allocator<Centaurus::DFAState<wchar_t>>>::
      emplace_back<Centaurus::DFAState<wchar_t>&,std::vector<Centaurus::NFATransition<wchar_t>,std::allocator<Centaurus::NFATransition<wchar_t>>>>
                ((vector<Centaurus::DFAState<wchar_t>,std::allocator<Centaurus::DFAState<wchar_t>>>
                  *)&nodes,pvVar3,&filtered);
      index_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[__n] = local_8c;
      local_8c = local_8c + 1;
      std::
      vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
      ::~vector(&filtered);
    }
    else {
      index_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[__n] = -1;
    }
    pDVar6 = (this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
             super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pDVar5 = (this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
             super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; pDVar4 != nodes.
                   super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pDVar4 = pDVar4 + 1) {
    pNVar1 = (pDVar4->super_NFABaseState<wchar_t,_Centaurus::IndexVector>).m_transitions.
             super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pNVar7 = (pDVar4->super_NFABaseState<wchar_t,_Centaurus::IndexVector>).m_transitions.
                  super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pNVar7 != pNVar1; pNVar7 = pNVar7 + 1)
    {
      pNVar7->m_dest =
           index_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[pNVar7->m_dest];
    }
  }
  std::vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>::
  _M_move_assign(this_00,&nodes);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&index_map.super__Vector_base<int,_std::allocator<int>_>);
  std::vector<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>::~vector
            (&nodes);
  return;
}

Assistant:

void filter_nodes(const std::vector<bool>& mask)
    {
        std::vector<DFAState<TCHAR> > nodes;
        std::vector<int> index_map(m_states.size());

        assert(m_states.size() == mask.size());

        for (int src_index = 0, dest_index = 0; src_index < m_states.size(); src_index++)
        {
            if (mask[src_index])
            {
                std::vector<DFATransition<TCHAR> > filtered;
                for (const auto& t : m_states.at(src_index).get_transitions())
                {
                    if (mask[t.dest()])
                    {
                        filtered.push_back(t);
                    }
                }
                nodes.emplace_back(m_states.at(src_index), std::move(filtered));
                index_map[src_index] = dest_index;
                dest_index++;
            }
            else
            {
                index_map[src_index] = -1;
            }
        }

        for (auto& n : nodes)
        {
            for (auto& t : n.get_transitions())
            {
                t.dest(index_map[t.dest()]);
            }
        }
        m_states = std::move(nodes);
    }